

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_utils.cpp
# Opt level: O0

void printComponent(ComponentPtr *component,size_t c,string *indent,bool includeMaths)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  bool bVar2;
  ostream *poVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  undefined1 local_360 [8];
  ComponentPtr child;
  size_t c2;
  undefined1 local_328 [8];
  string newIndent;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  shared_ptr<libcellml::Units> local_2c8;
  string local_2b8 [32];
  shared_ptr<libcellml::Units> local_298;
  string local_288 [32];
  string local_268 [32];
  shared_ptr<libcellml::ParentedEntity> local_248;
  undefined1 local_238 [8];
  ComponentPtr ev_parent;
  shared_ptr<libcellml::Variable> local_220;
  undefined1 local_210 [8];
  VariablePtr ev;
  ulong local_1f0;
  size_t e;
  string local_1e0 [8];
  string con;
  shared_ptr<libcellml::Variable> local_1b0;
  string local_1a0 [32];
  shared_ptr<libcellml::Variable> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  shared_ptr<libcellml::Variable> local_150;
  shared_ptr<libcellml::Units> local_140;
  string local_130 [32];
  shared_ptr<libcellml::Variable> local_110;
  shared_ptr<libcellml::Units> local_100;
  shared_ptr<libcellml::Variable> local_f0;
  string local_e0 [32];
  ulong local_c0;
  size_t v;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string local_78 [48];
  string local_48 [39];
  byte local_21;
  string *psStack_20;
  bool includeMaths_local;
  string *indent_local;
  size_t c_local;
  ComponentPtr *component_local;
  
  local_21 = includeMaths;
  psStack_20 = indent;
  indent_local = (string *)c;
  c_local = (size_t)component;
  if (c == 0xffffffffffffffff) {
    poVar3 = std::operator<<((ostream *)&std::cout,"COMPONENT: \'");
    std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)c_local);
    libcellml::NamedEntity::name_abi_cxx11_();
    poVar3 = std::operator<<(poVar3,local_48);
    std::operator<<(poVar3,"\'");
    std::__cxx11::string::~string(local_48);
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cout,(string *)indent);
    poVar3 = std::operator<<(poVar3,"[");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(ulong)&indent_local->field_0x1);
    poVar3 = std::operator<<(poVar3,"]: ");
    std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)c_local);
    libcellml::NamedEntity::name_abi_cxx11_();
    std::operator<<(poVar3,local_78);
    std::__cxx11::string::~string(local_78);
  }
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             c_local);
  libcellml::Entity::id_abi_cxx11_();
  bVar2 = std::operator!=(&local_98,"");
  std::__cxx11::string::~string((string *)&local_98);
  if (bVar2) {
    poVar3 = std::operator<<((ostream *)&std::cout,", id: ");
    std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)c_local);
    libcellml::Entity::id_abi_cxx11_();
    std::operator<<(poVar3,(string *)&v);
    std::__cxx11::string::~string((string *)&v);
  }
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,(string *)psStack_20);
  poVar3 = std::operator<<(poVar3,(string *)&FIXED_INDENT_abi_cxx11_);
  poVar3 = std::operator<<(poVar3,"VARIABLES: ");
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             c_local);
  uVar4 = libcellml::Component::variableCount();
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar4);
  poVar3 = std::operator<<(poVar3," variables");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  local_c0 = 0;
  while( true ) {
    uVar4 = local_c0;
    std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)c_local);
    uVar5 = libcellml::Component::variableCount();
    if (uVar5 <= uVar4) break;
    poVar3 = std::operator<<((ostream *)&std::cout,(string *)psStack_20);
    poVar3 = std::operator<<(poVar3,(string *)&FIXED_INDENT_abi_cxx11_);
    std::operator<<(poVar3,(string *)&FIXED_INDENT_abi_cxx11_);
    poVar3 = std::operator<<((ostream *)&std::cout,"[");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_c0 + 1);
    poVar3 = std::operator<<(poVar3,"]: ");
    std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)c_local);
    libcellml::Component::variable((ulong)&local_f0);
    std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )&local_f0);
    libcellml::NamedEntity::name_abi_cxx11_();
    std::operator<<(poVar3,local_e0);
    std::__cxx11::string::~string(local_e0);
    std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_f0);
    std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)c_local);
    libcellml::Component::variable((ulong)&local_110);
    std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )&local_110);
    libcellml::Variable::units();
    bVar2 = std::operator!=(&local_100,(nullptr_t)0x0);
    std::shared_ptr<libcellml::Units>::~shared_ptr(&local_100);
    std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_110);
    if (bVar2) {
      poVar3 = std::operator<<((ostream *)&std::cout," [");
      std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)c_local);
      libcellml::Component::variable((ulong)&local_150);
      std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)&local_150);
      libcellml::Variable::units();
      std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 &local_140);
      libcellml::NamedEntity::name_abi_cxx11_();
      poVar3 = std::operator<<(poVar3,local_130);
      std::operator<<(poVar3,"]");
      std::__cxx11::string::~string(local_130);
      std::shared_ptr<libcellml::Units>::~shared_ptr(&local_140);
      std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_150);
    }
    std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)c_local);
    libcellml::Component::variable((ulong)&local_180);
    std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )&local_180);
    libcellml::Variable::initialValue_abi_cxx11_();
    bVar2 = std::operator!=(&local_170,"");
    std::__cxx11::string::~string((string *)&local_170);
    std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_180);
    if (bVar2) {
      poVar3 = std::operator<<((ostream *)&std::cout,", initial = ");
      std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)c_local);
      libcellml::Component::variable((ulong)&local_1b0);
      std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)&local_1b0);
      libcellml::Variable::initialValue_abi_cxx11_();
      std::operator<<(poVar3,local_1a0);
      std::__cxx11::string::~string(local_1a0);
      std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_1b0);
    }
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)c_local);
    libcellml::Component::variable((ulong)(con.field_2._M_local_buf + 8));
    std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )(con.field_2._M_local_buf + 8));
    lVar6 = libcellml::Variable::equivalentVariableCount();
    std::shared_ptr<libcellml::Variable>::~shared_ptr
              ((shared_ptr<libcellml::Variable> *)((long)&con.field_2 + 8));
    if (lVar6 != 0) {
      poVar3 = std::operator<<((ostream *)&std::cout,(string *)psStack_20);
      poVar3 = std::operator<<(poVar3,(string *)&FIXED_INDENT_abi_cxx11_);
      poVar3 = std::operator<<(poVar3,(string *)&FIXED_INDENT_abi_cxx11_);
      std::operator<<(poVar3,(string *)&FIXED_INDENT_abi_cxx11_);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_1e0,anon_var_dwarf_ad4e,(allocator<char> *)((long)&e + 7));
      std::allocator<char>::~allocator((allocator<char> *)((long)&e + 7));
      local_1f0 = 0;
      while( true ) {
        std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)c_local);
        libcellml::Component::variable
                  ((ulong)&ev.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount);
        std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)&ev.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount);
        uVar4 = libcellml::Variable::equivalentVariableCount();
        std::shared_ptr<libcellml::Variable>::~shared_ptr
                  ((shared_ptr<libcellml::Variable> *)
                   &ev.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        if (uVar4 <= local_1f0) break;
        std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)c_local);
        libcellml::Component::variable((ulong)&local_220);
        std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)&local_220);
        libcellml::Variable::equivalentVariable((ulong)local_210);
        std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_220);
        bVar2 = std::operator==((shared_ptr<libcellml::Variable> *)local_210,(nullptr_t)0x0);
        if (bVar2) {
          std::operator<<((ostream *)&std::cout,"WHOOPS! Null equivalent variable!");
          ev_parent.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi._4_4_ = 7;
        }
        else {
          std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)local_210);
          libcellml::ParentedEntity::parent();
          std::dynamic_pointer_cast<libcellml::Component,libcellml::ParentedEntity>
                    ((shared_ptr<libcellml::ParentedEntity> *)local_238);
          std::shared_ptr<libcellml::ParentedEntity>::~shared_ptr(&local_248);
          bVar2 = std::operator==((shared_ptr<libcellml::Component> *)local_238,(nullptr_t)0x0);
          if (bVar2) {
            std::operator<<((ostream *)&std::cout,
                            "WHOOPS! Null parent component for equivalent variable!");
            ev_parent.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi._4_4_ = 7;
          }
          else {
            poVar3 = std::operator<<((ostream *)&std::cout,local_1e0);
            std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_238);
            libcellml::NamedEntity::name_abi_cxx11_();
            poVar3 = std::operator<<(poVar3,local_268);
            poVar3 = std::operator<<(poVar3,":");
            std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_210);
            libcellml::NamedEntity::name_abi_cxx11_();
            std::operator<<(poVar3,local_288);
            std::__cxx11::string::~string(local_288);
            std::__cxx11::string::~string(local_268);
            std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_210);
            libcellml::Variable::units();
            bVar2 = std::operator!=(&local_298,(nullptr_t)0x0);
            std::shared_ptr<libcellml::Units>::~shared_ptr(&local_298);
            if (bVar2) {
              poVar3 = std::operator<<((ostream *)&std::cout," [");
              std::
              __shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_210);
              libcellml::Variable::units();
              std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&local_2c8);
              libcellml::NamedEntity::name_abi_cxx11_();
              poVar3 = std::operator<<(poVar3,local_2b8);
              std::operator<<(poVar3,"]");
              std::__cxx11::string::~string(local_2b8);
              std::shared_ptr<libcellml::Units>::~shared_ptr(&local_2c8);
            }
            std::__cxx11::string::operator=(local_1e0,", ");
            ev_parent.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi._4_4_ = 0;
          }
          std::shared_ptr<libcellml::Component>::~shared_ptr
                    ((shared_ptr<libcellml::Component> *)local_238);
        }
        std::shared_ptr<libcellml::Variable>::~shared_ptr
                  ((shared_ptr<libcellml::Variable> *)local_210);
        local_1f0 = local_1f0 + 1;
      }
      std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_1e0);
    }
    local_c0 = local_c0 + 1;
  }
  if ((local_21 & 1) != 0) {
    std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)c_local);
    libcellml::Component::math_abi_cxx11_();
    bVar2 = std::operator!=(&local_2e8,"");
    std::__cxx11::string::~string((string *)&local_2e8);
    if (bVar2) {
      poVar3 = std::operator<<((ostream *)&std::cout,(string *)psStack_20);
      poVar3 = std::operator<<(poVar3,"  Maths in the component is:");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)c_local);
      libcellml::Component::math_abi_cxx11_();
      poVar3 = std::operator<<((ostream *)&std::cout,(string *)(newIndent.field_2._M_local_buf + 8))
      ;
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)(newIndent.field_2._M_local_buf + 8));
    }
  }
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             c_local);
  lVar6 = libcellml::ComponentEntity::componentCount();
  if (lVar6 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cout,(string *)psStack_20);
    poVar3 = std::operator<<(poVar3,(string *)&FIXED_INDENT_abi_cxx11_);
    poVar3 = std::operator<<(poVar3,"CHILD COMPONENTS: ");
    std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)c_local);
    uVar4 = libcellml::ComponentEntity::componentCount();
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar4);
    poVar3 = std::operator<<(poVar3," child components");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&c2,
                   psStack_20,&FIXED_INDENT_abi_cxx11_);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&c2,
                   &FIXED_INDENT_abi_cxx11_);
    std::__cxx11::string::~string((string *)&c2);
    child.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    while( true ) {
      _Var1._M_pi = child.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
      std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)c_local);
      p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               libcellml::ComponentEntity::componentCount();
      if (p_Var7 <= _Var1._M_pi) break;
      std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)c_local);
      libcellml::ComponentEntity::component((ulong)local_360);
      printComponent((ComponentPtr *)local_360,
                     (size_t)child.
                             super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi,(string *)local_328,(bool)(local_21 & 1));
      std::shared_ptr<libcellml::Component>::~shared_ptr
                ((shared_ptr<libcellml::Component> *)local_360);
      child.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           child.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi + 1;
    }
    std::__cxx11::string::~string((string *)local_328);
  }
  return;
}

Assistant:

void printComponent(const libcellml::ComponentPtr &component, size_t c, const std::string &indent, bool includeMaths)
{
    if (c == SIZE_MAX) {
        std::cout << "COMPONENT: '" << component->name() << "'";
    } else {
        std::cout << indent << "[" << c + 1 << "]: " << component->name();
    }

    if (component->id() != "") {
        std::cout << ", id: " << component->id();
    }

    std::cout << std::endl;
    std::cout << indent << FIXED_INDENT << "VARIABLES: " << component->variableCount() << " variables" << std::endl;

    // Printing the variables within the component.
    for (size_t v = 0; v < component->variableCount(); ++v) {
        std::cout << indent << FIXED_INDENT << FIXED_INDENT;
        std::cout << "[" << v + 1 << "]: " << component->variable(v)->name();
        if (component->variable(v)->units() != nullptr) {
            std::cout << " [" << component->variable(v)->units()->name() << "]";
        }
        if (component->variable(v)->initialValue() != "") {
            std::cout << ", initial = " << component->variable(v)->initialValue();
        }
        std::cout << std::endl;
        if (component->variable(v)->equivalentVariableCount() > 0) {
            std::cout << indent << FIXED_INDENT << FIXED_INDENT << FIXED_INDENT;
            std::string con = "  └──> ";
            for (size_t e = 0; e < component->variable(v)->equivalentVariableCount(); ++e) {
                auto ev = component->variable(v)->equivalentVariable(e);
                if (ev == nullptr) {
                    std::cout << "WHOOPS! Null equivalent variable!";
                    continue;
                }
                libcellml::ComponentPtr ev_parent = std::dynamic_pointer_cast<libcellml::Component>(ev->parent());
                if (ev_parent == nullptr) {
                    std::cout << "WHOOPS! Null parent component for equivalent variable!";
                    continue;
                }
                std::cout << con << ev_parent->name() << ":" << ev->name();
                if (ev->units() != nullptr) {
                    std::cout << " [" << ev->units()->name() << "]";
                }
                con = ", ";
            }
            std::cout << std::endl;
        }
    }

    // Print the maths within the component.
    if (includeMaths) {
        if (component->math() != "") {
            std::cout << indent << "  Maths in the component is:" << std::endl;
            std::cout << component->math() << std::endl;
        }
    }

    // Print the encapsulated components
    if (component->componentCount() > 0) {
        std::cout << indent << FIXED_INDENT << "CHILD COMPONENTS: " << component->componentCount()
                  << " child components" << std::endl;
        std::string newIndent = indent + FIXED_INDENT + FIXED_INDENT;

        for (size_t c2 = 0; c2 < component->componentCount(); ++c2) {
            auto child = component->component(c2);
            printComponent(child, c2, newIndent, includeMaths);
        }
    }
}